

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

void stat_cb(uv_fs_t *req)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (req == &stat_req) {
    if ((stat_req.fs_type & ~UV_FS_OPEN) == UV_FS_STAT) {
      if (stat_req.result == 0) {
        if (stat_req.ptr == (void *)0x0) {
          pcVar2 = "req->ptr";
          uVar1 = 0x29d;
        }
        else {
          stat_cb_count = stat_cb_count + 1;
          uv_fs_req_cleanup(&stat_req);
          if (stat_req.ptr == (void *)0x0) {
            return;
          }
          pcVar2 = "!req->ptr";
          uVar1 = 0x2a0;
        }
      }
      else {
        pcVar2 = "req->result == 0";
        uVar1 = 0x29c;
      }
    }
    else {
      pcVar2 = "req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT";
      uVar1 = 0x29b;
    }
  }
  else {
    pcVar2 = "req == &stat_req";
    uVar1 = 0x29a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar1,pcVar2);
  abort();
}

Assistant:

static void stat_cb(uv_fs_t* req) {
  ASSERT(req == &stat_req);
  ASSERT(req->fs_type == UV_FS_STAT || req->fs_type == UV_FS_LSTAT);
  ASSERT(req->result == 0);
  ASSERT(req->ptr);
  stat_cb_count++;
  uv_fs_req_cleanup(req);
  ASSERT(!req->ptr);
}